

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O0

_Bool is_null_bytes(uchar *bytes,size_t bytes_len)

{
  ulong local_28;
  size_t i;
  size_t bytes_len_local;
  uchar *bytes_local;
  
  local_28 = 0;
  while( true ) {
    if (bytes_len <= local_28) {
      return true;
    }
    if (bytes[local_28] != '\0') break;
    local_28 = local_28 + 1;
  }
  return false;
}

Assistant:

static bool is_null_bytes(const unsigned char *bytes, size_t bytes_len)
{
    size_t i;
    for (i = 0; i < bytes_len; ++i)
        if (bytes[i])
            return false;
    return true;
}